

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

void __thiscall PlayerA::SetConfiguration(PlayerA *this,Config *config)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  UINT8 UVar4;
  undefined2 uVar5;
  UINT32 UVar6;
  UINT32 UVar7;
  UINT32 UVar8;
  undefined4 uVar9;
  INT32 IVar10;
  
  dVar1 = (this->_config).pbSpeed;
  bVar3 = config->ignoreVolGain;
  UVar4 = config->chnInvert;
  uVar5 = *(undefined2 *)&config->field_0x6;
  UVar6 = config->loopCount;
  UVar7 = config->fadeSmpls;
  UVar8 = config->endSilenceSmpls;
  uVar9 = *(undefined4 *)&config->field_0x14;
  dVar2 = config->pbSpeed;
  (this->_config).masterVol = config->masterVol;
  (this->_config).ignoreVolGain = bVar3;
  (this->_config).chnInvert = UVar4;
  *(undefined2 *)&(this->_config).field_0x6 = uVar5;
  (this->_config).loopCount = UVar6;
  (this->_config).fadeSmpls = UVar7;
  (this->_config).endSilenceSmpls = UVar8;
  *(undefined4 *)&(this->_config).field_0x14 = uVar9;
  (this->_config).pbSpeed = dVar2;
  IVar10 = CalcSongVolume(this);
  this->_songVolume = IVar10;
  dVar2 = (this->_config).pbSpeed;
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    return;
  }
  SetPlaybackSpeed(this,dVar2);
  return;
}

Assistant:

void PlayerA::SetConfiguration(const PlayerA::Config& config)
{
	double oldPbSpeed = _config.pbSpeed;
	
	_config = config;
	SetMasterVolume(_config.masterVol);
	if (oldPbSpeed != _config.pbSpeed)
		SetPlaybackSpeed(_config.pbSpeed);	// refresh in all players
	return;
}